

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaterialSystem.cpp
# Opt level: O3

uint32_t Assimp::ComputeMaterialHash(aiMaterial *mat,bool includeMatName)

{
  uint uVar1;
  aiMaterialProperty **ppaVar2;
  aiMaterialProperty *paVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  char *__s;
  ushort *__s_00;
  
  uVar1 = mat->mNumProperties;
  if ((ulong)uVar1 == 0) {
    uVar8 = 0x5df;
  }
  else {
    ppaVar2 = mat->mProperties;
    uVar8 = 0x5df;
    uVar9 = 0;
    do {
      paVar3 = ppaVar2[uVar9];
      if ((paVar3 == (aiMaterialProperty *)0x0) ||
         ((!includeMatName && ((paVar3->mKey).data[0] == '?')))) goto LAB_00141ba0;
      __s = (paVar3->mKey).data;
      uVar4 = (paVar3->mKey).length;
      if (uVar4 == 0) {
        sVar6 = strlen(__s);
        uVar4 = (uint)sVar6;
      }
      if (3 < uVar4) {
        uVar7 = uVar4 >> 2;
        do {
          uVar8 = (*(ushort *)__s + uVar8) * 0x10000 ^
                  (uint)*(ushort *)(__s + 2) << 0xb ^ *(ushort *)__s + uVar8;
          __s = __s + 4;
          uVar8 = (uVar8 >> 0xb) + uVar8;
          uVar7 = uVar7 - 1;
        } while (uVar7 != 0);
      }
      switch(uVar4 & 3) {
      case 1:
        uVar4 = (uVar8 + (int)*__s) * 0x400 ^ uVar8 + (int)*__s;
        uVar8 = uVar4 >> 1;
        goto LAB_001419cd;
      case 2:
        uVar4 = (uVar8 + *(ushort *)__s) * 0x800 ^ uVar8 + *(ushort *)__s;
        uVar8 = uVar4 >> 0x11;
LAB_001419cd:
        uVar8 = uVar8 + uVar4;
        break;
      case 3:
        uVar8 = (uVar8 + *(ushort *)__s) * 0x10000 ^ (int)__s[2] << 0x12 ^ uVar8 + *(ushort *)__s;
        uVar8 = (uVar8 >> 0xb) + uVar8;
      }
      __s_00 = (ushort *)paVar3->mData;
      if (__s_00 == (ushort *)0x0) {
        iVar5 = 0;
        goto LAB_00141b05;
      }
      uVar4 = paVar3->mDataLength;
      if (uVar4 == 0) {
        sVar6 = strlen((char *)__s_00);
        uVar4 = (uint)sVar6;
      }
      uVar8 = uVar8 * 8 ^ uVar8;
      uVar8 = (uVar8 >> 5) + uVar8;
      uVar8 = uVar8 * 0x10 ^ uVar8;
      uVar8 = (uVar8 >> 0x11) + uVar8;
      uVar8 = uVar8 * 0x2000000 ^ uVar8;
      uVar8 = (uVar8 >> 6) + uVar8;
      if (3 < uVar4) {
        uVar7 = uVar4 >> 2;
        do {
          uVar8 = (*__s_00 + uVar8) * 0x10000 ^ (uint)__s_00[1] << 0xb ^ *__s_00 + uVar8;
          __s_00 = __s_00 + 2;
          uVar8 = (uVar8 >> 0xb) + uVar8;
          uVar7 = uVar7 - 1;
        } while (uVar7 != 0);
      }
      switch(uVar4 & 3) {
      case 1:
        uVar8 = uVar8 + (int)(char)*__s_00;
        uVar4 = uVar8 * 0x400 ^ uVar8;
        uVar8 = uVar4 >> 1;
        goto LAB_00141ab7;
      case 2:
        uVar4 = (uVar8 + *__s_00) * 0x800 ^ uVar8 + *__s_00;
        uVar8 = uVar4 >> 0x11;
LAB_00141ab7:
        uVar8 = uVar8 + uVar4;
        break;
      case 3:
        uVar8 = (uVar8 + *__s_00) * 0x10000 ^ (int)(char)__s_00[1] << 0x12 ^ uVar8 + *__s_00;
        uVar8 = (uVar8 >> 0xb) + uVar8;
      }
      uVar8 = uVar8 * 8 ^ uVar8;
      uVar8 = (uVar8 >> 5) + uVar8;
      uVar8 = uVar8 * 0x10 ^ uVar8;
      uVar8 = (uVar8 >> 0x11) + uVar8;
      uVar8 = uVar8 * 0x2000000 ^ uVar8;
      iVar5 = (uVar8 >> 6) + uVar8;
LAB_00141b05:
      uVar8 = (uint)(ushort)paVar3->mSemantic + iVar5;
      uVar8 = uVar8 * 0x10000 ^ (uint)*(ushort *)((long)&paVar3->mSemantic + 2) << 0xb ^ uVar8;
      uVar8 = (uVar8 >> 0xb) + uVar8;
      uVar8 = uVar8 * 8 ^ uVar8;
      uVar8 = (uVar8 >> 5) + uVar8;
      uVar8 = uVar8 * 0x10 ^ uVar8;
      uVar8 = (uVar8 >> 0x11) + uVar8;
      uVar8 = uVar8 * 0x2000000 ^ uVar8;
      uVar8 = (ushort)paVar3->mIndex + uVar8 + (uVar8 >> 6);
      uVar8 = uVar8 * 0x10000 ^ (uint)*(ushort *)((long)&paVar3->mIndex + 2) << 0xb ^ uVar8;
      uVar8 = (uVar8 >> 0xb) + uVar8;
      uVar8 = uVar8 * 8 ^ uVar8;
      uVar8 = (uVar8 >> 5) + uVar8;
      uVar8 = uVar8 * 0x10 ^ uVar8;
      uVar8 = (uVar8 >> 0x11) + uVar8;
      uVar8 = uVar8 * 0x2000000 ^ uVar8;
      uVar8 = (uVar8 >> 6) + uVar8;
LAB_00141ba0:
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar1);
  }
  return uVar8;
}

Assistant:

uint32_t Assimp::ComputeMaterialHash(const aiMaterial* mat, bool includeMatName /*= false*/)
{
    uint32_t hash = 1503; // magic start value, chosen to be my birthday :-)
    for ( unsigned int i = 0; i < mat->mNumProperties; ++i ) {
        aiMaterialProperty* prop;

        // Exclude all properties whose first character is '?' from the hash
        // See doc for aiMaterialProperty.
        if ((prop = mat->mProperties[i]) && (includeMatName || prop->mKey.data[0] != '?'))  {

            hash = SuperFastHash(prop->mKey.data,(unsigned int)prop->mKey.length,hash);
            hash = SuperFastHash(prop->mData,prop->mDataLength,hash);

            // Combine the semantic and the index with the hash
            hash = SuperFastHash((const char*)&prop->mSemantic,sizeof(unsigned int),hash);
            hash = SuperFastHash((const char*)&prop->mIndex,sizeof(unsigned int),hash);
        }
    }
    return hash;
}